

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::StatusErrorListener::InvalidValue
          (StatusErrorListener *this,LocationTrackerInterface *loc,StringPiece type_name,
          StringPiece value)

{
  StringPiece error_message;
  LocationTrackerInterface *loc_00;
  char *pcVar1;
  AlphaNum *in_stack_fffffffffffffe28;
  AlphaNum local_1d0;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  AlphaNum local_170;
  AlphaNum local_140;
  AlphaNum local_110;
  string local_e0;
  Status local_c0;
  string local_98;
  char *local_78;
  size_t local_70;
  char local_68 [16];
  char *local_58;
  size_t local_50;
  char local_48 [16];
  StatusErrorListener *local_38;
  
  pcVar1 = value.ptr_;
  loc_00 = (LocationTrackerInterface *)type_name.ptr_;
  local_38 = this;
  (anonymous_namespace)::StatusErrorListener::GetLocString_abi_cxx11_(&local_e0,loc,loc_00);
  local_1a0 = local_e0._M_dataplus._M_p._0_4_;
  uStack_19c = local_e0._M_dataplus._M_p._4_4_;
  uStack_198 = (undefined4)local_e0._M_string_length;
  uStack_194 = local_e0._M_string_length._4_4_;
  local_170.piece_data_ = ": invalid value ";
  local_170.piece_size_ = 0x10;
  local_78 = local_68;
  if (pcVar1 == (char *)0x0) {
    local_70 = 0;
    local_68[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,pcVar1,pcVar1 + value.length_);
  }
  local_140.piece_data_ = local_78;
  local_140.piece_size_ = local_70;
  local_110.piece_data_ = " for type ";
  local_110.piece_size_ = 10;
  local_58 = local_48;
  if (loc_00 == (LocationTrackerInterface *)0x0) {
    local_50 = 0;
    local_48[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,loc_00,
               (long)&loc_00->_vptr_LocationTrackerInterface + type_name.length_);
  }
  local_1d0.piece_data_ = local_58;
  local_1d0.piece_size_ = local_50;
  StrCat_abi_cxx11_(&local_98,(protobuf *)&local_1a0,&local_170,&local_140,&local_110,&local_1d0,
                    in_stack_fffffffffffffe28);
  error_message.length_ = local_98._M_string_length;
  error_message.ptr_ = local_98._M_dataplus._M_p;
  if ((long)local_98._M_string_length < 0) {
    StringPiece::LogFatalSizeTooBig(local_98._M_string_length,"size_t to int conversion");
  }
  Status::Status(&local_c0,INVALID_ARGUMENT,error_message);
  Status::operator=(&local_38->status_,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.error_message_._M_dataplus._M_p != &local_c0.error_message_.field_2) {
    operator_delete(local_c0.error_message_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_) !=
      &local_e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_));
  }
  return;
}

Assistant:

void InvalidValue(const converter::LocationTrackerInterface& loc,
                    StringPiece type_name,
                    StringPiece value) override {
    status_ = util::Status(
        util::error::INVALID_ARGUMENT,
        StrCat(GetLocString(loc), ": invalid value ", string(value),
                     " for type ", string(type_name)));
  }